

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

VariablePairPtr __thiscall libcellml::AnyCellmlElement::variablePair(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::VariablePair> sVar1;
  VariablePairPtr VVar2;
  
  if ((*(int *)*in_RSI == 5) || (*(int *)*in_RSI == 2)) {
    sVar1 = std::any_cast<std::shared_ptr<libcellml::VariablePair>>((any *)this);
    in_RDX = sVar1.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  VVar2.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  VVar2.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePairPtr)
         VVar2.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePairPtr AnyCellmlElement::variablePair() const
{
    if ((mPimpl->mType == CellmlElementType::CONNECTION)
        || (mPimpl->mType == CellmlElementType::MAP_VARIABLES)) {
        try {
            return std::any_cast<VariablePairPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}